

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<float>_>::Decompose_Cholesky
          (TPZMatrix<std::complex<float>_> *this,list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  list<long,_std::allocator<long>_> *plVar2;
  char cVar3;
  int iVar4;
  int extraout_var;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar9;
  float __z;
  float __z_00;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float __z_01;
  float extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  undefined8 uVar10;
  float extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dc_01;
  uint extraout_XMM0_Dc_02;
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  uint extraout_XMM0_Dd_01;
  uint extraout_XMM0_Dd_02;
  float fVar11;
  complex<float> tmp;
  undefined8 local_70;
  float local_68;
  float fStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined8 local_58;
  _List_node_base *local_50;
  float local_48;
  float fStack_44;
  list<long,_std::allocator<long>_> *local_38;
  _List_node_base *p_Var5;
  
  cVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  local_38 = singular;
  if ((cVar3 != '\0') && (cVar3 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar3 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    p_Var5 = (_List_node_base *)CONCAT44(extraout_var,iVar4);
    if (p_Var5 != (_List_node_base *)0x0 && -1 < extraout_var) {
      p_Var7 = (_List_node_base *)0x0;
      do {
        if (p_Var7 != (_List_node_base *)0x0) {
          p_Var6 = (_List_node_base *)0x0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var7,p_Var7);
            local_68 = extraout_XMM0_Da;
            fStack_64 = extraout_XMM0_Db;
            uStack_60 = extraout_XMM0_Dc;
            uStack_5c = extraout_XMM0_Dd;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var7,p_Var6);
            local_48 = extraout_XMM0_Da_00;
            fStack_44 = extraout_XMM0_Db_00;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var7,p_Var6);
            fVar9 = local_48 * extraout_XMM0_Da_01 - fStack_44 * extraout_XMM0_Db_01;
            fVar11 = local_48 * extraout_XMM0_Db_01 + fStack_44 * extraout_XMM0_Da_01;
            uVar10 = CONCAT44(fVar11,fVar9);
            if ((NAN(fVar9)) && (uVar10 = CONCAT44(fVar11,fVar9), NAN(fVar11))) {
              uVar10 = __mulsc3(local_48,fStack_44,extraout_XMM0_Da_01,extraout_XMM0_Db_01);
            }
            local_70 = CONCAT44(fStack_64 - (float)((ulong)uVar10 >> 0x20),local_68 - (float)uVar10)
            ;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,p_Var7,p_Var7,&local_70);
            p_Var6 = (_List_node_base *)((long)&p_Var6->_M_next + 1);
          } while (p_Var7 != p_Var6);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var7,p_Var7);
        local_68 = cabsf(__z);
        local_68 = ABS(local_68);
        fStack_64 = ABS(extraout_XMM0_Db_02);
        uStack_60 = extraout_XMM0_Dc_00 & 0x7fffffff;
        uStack_5c = extraout_XMM0_Dd_00 & 0x7fffffff;
        fVar9 = cabsf(1e-12);
        if (local_68 <= ABS(fVar9)) {
          p_Var6 = (_List_node_base *)operator_new(0x18);
          plVar2 = local_38;
          p_Var6[1]._M_next = p_Var7;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &(plVar2->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          local_70 = 0x3f800000;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,p_Var7,p_Var7,&local_70);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var7,p_Var7);
        fVar9 = csqrtf(__z_00);
        local_70 = CONCAT44(extraout_XMM0_Db_03,fVar9);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,p_Var7,p_Var7,&local_70);
        p_Var6 = (_List_node_base *)((long)&p_Var7->_M_next + 1);
        local_50 = p_Var6;
        for (; (long)p_Var6 < (long)p_Var5; p_Var6 = (_List_node_base *)((long)&p_Var6->_M_next + 1)
            ) {
          if (p_Var7 != (_List_node_base *)0x0) {
            p_Var8 = (_List_node_base *)0x0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,p_Var7,p_Var6);
              local_68 = extraout_XMM0_Da_02;
              fStack_64 = extraout_XMM0_Db_04;
              uStack_60 = extraout_XMM0_Dc_01;
              uStack_5c = extraout_XMM0_Dd_01;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,p_Var7,p_Var8);
              local_48 = extraout_XMM0_Da_03;
              fStack_44 = extraout_XMM0_Db_05;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,p_Var8,p_Var6);
              fVar9 = local_48 * extraout_XMM0_Da_04 - fStack_44 * extraout_XMM0_Db_06;
              fVar11 = local_48 * extraout_XMM0_Db_06 + fStack_44 * extraout_XMM0_Da_04;
              uVar10 = CONCAT44(fVar11,fVar9);
              if ((NAN(fVar9)) && (uVar10 = CONCAT44(fVar11,fVar9), NAN(fVar11))) {
                uVar10 = __mulsc3(local_48,fStack_44,extraout_XMM0_Da_04,extraout_XMM0_Db_06);
              }
              local_58 = CONCAT44(fStack_64 - (float)((ulong)uVar10 >> 0x20),
                                  local_68 - (float)uVar10);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (this,p_Var7,p_Var6,&local_58);
              p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + 1);
            } while (p_Var7 != p_Var8);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var7,p_Var7)
          ;
          fVar9 = cabsf(__z_01);
          if (ABS(fVar9) < 1e-07) {
            Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var7,p_Var6)
          ;
          local_68 = extraout_XMM0_Da_05;
          fStack_64 = extraout_XMM0_Db_07;
          uStack_60 = extraout_XMM0_Dc_02;
          uStack_5c = extraout_XMM0_Dd_02;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var7,p_Var7)
          ;
          local_58 = __divsc3(local_68,fStack_64,extraout_XMM0_Da_06,extraout_XMM0_Db_08);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,p_Var7,p_Var6,&local_58);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var7,p_Var6)
          ;
          local_58 = CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_07);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,p_Var6,p_Var7,&local_58);
        }
        p_Var7 = local_50;
      } while (local_50 != p_Var5);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}